

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_parse_assign_expr2(JSParseState *s,int parse_flags)

{
  char cVar1;
  bool bVar2;
  uint label_00;
  uint8_t val;
  int iVar3;
  int iVar4;
  char *fmt;
  JSAtom JVar5;
  JSAtom name;
  JSAtom local_48;
  int depth_lvalue;
  int opcode;
  uint local_3c;
  int label;
  int scope;
  
  iVar3 = (s->token).val;
  if (iVar3 == -0x7d) {
    JVar5 = (s->token).u.ident.atom;
  }
  else {
    JVar5 = 0;
    if (iVar3 == -0x29) {
      if ((s->cur_func->field_0x84 & 1) == 0) {
        fmt = "unexpected \'yield\' keyword";
      }
      else {
        if (s->cur_func->in_function_body != 0) {
          iVar3 = next_token(s);
          if (iVar3 != 0) {
            return -1;
          }
          iVar3 = (s->token).val;
          if ((((iVar3 - 0x29U < 0x35) &&
               ((0x10000000060009U >> ((ulong)(iVar3 - 0x29U) & 0x3f) & 1) != 0)) || (iVar3 == 0x7d)
              ) || (s->got_lf != 0)) {
            emit_op(s,'\x06');
            bVar2 = false;
          }
          else {
            bVar2 = false;
            if (iVar3 == 0x2a) {
              iVar3 = next_token(s);
              if (iVar3 != 0) {
                return -1;
              }
              bVar2 = true;
            }
            iVar3 = js_parse_assign_expr2(s,parse_flags);
            if (iVar3 != 0) {
              return -1;
            }
          }
          cVar1 = s->cur_func->field_0x84;
          if (!bVar2) {
            if (cVar1 == '\x03') {
              emit_op(s,0x8b);
            }
            emit_op(s,0x88);
            iVar3 = emit_goto(s,0x69,-1);
            emit_return(s,1);
            emit_label(s,iVar3);
            return 0;
          }
          iVar3 = new_label(s);
          iVar4 = new_label(s);
          emit_op(s,(cVar1 == '\x03') + '}');
          emit_op(s,'\x0e');
          emit_op(s,'\x06');
          emit_op(s,'\x06');
          emit_label(s,iVar3);
          emit_op(s,0x85);
          if (cVar1 == '\x03') {
            emit_op(s,0x8b);
          }
          emit_op(s,0x81);
          emit_op(s,'B');
          emit_u32(s,0x69);
          local_3c = emit_goto(s,0x6a,-1);
          local_48 = iVar4;
          emit_label(s,iVar4);
          val = 0x89;
          if (cVar1 == '\x03') {
            emit_op(s,'A');
            emit_u32(s,0x40);
            emit_op(s,0x8b);
            val = 0x8a;
          }
          emit_op(s,val);
          emit_op(s,'\x11');
          iVar4 = emit_goto(s,0x6a,-1);
          emit_op(s,'\x0e');
          emit_goto(s,0x6b,iVar3);
          emit_label(s,iVar4);
          emit_op(s,'\x01');
          emit_u32(s,2);
          emit_op(s,0xab);
          iVar3 = emit_goto(s,0x6a,-1);
          if (cVar1 == '\x03') {
            emit_op(s,0x8b);
          }
          emit_op(s,0x86);
          emit_u8(s,'\0');
          iVar4 = emit_goto(s,0x6a,-1);
          JVar5 = local_48;
          if (cVar1 == '\x03') {
            emit_op(s,0x8b);
          }
          emit_op(s,0x81);
          emit_op(s,'B');
          emit_u32(s,0x69);
          emit_goto(s,0x69,JVar5);
          emit_op(s,'A');
          emit_u32(s,0x40);
          emit_label(s,iVar4);
          emit_op(s,'\x0f');
          emit_op(s,'\x0f');
          emit_op(s,'\x0f');
          emit_return(s,1);
          emit_label(s,iVar3);
          emit_op(s,0x86);
          emit_u8(s,'\x01');
          iVar3 = emit_goto(s,0x6a,-1);
          if (cVar1 == '\x03') {
            emit_op(s,0x8b);
          }
          emit_op(s,0x81);
          emit_op(s,'B');
          emit_u32(s,0x69);
          emit_goto(s,0x69,JVar5);
          label_00 = local_3c;
          emit_goto(s,0x6b,local_3c);
          emit_label(s,iVar3);
          emit_op(s,0x86);
          emit_u8(s,'\x02');
          iVar3 = emit_goto(s,0x6a,-1);
          if (cVar1 == '\x03') {
            emit_op(s,0x8b);
          }
          emit_label(s,iVar3);
          emit_op(s,'0');
          emit_u32(s,0);
          emit_u8(s,'\x04');
          emit_label(s,label_00);
          emit_op(s,'A');
          emit_u32(s,0x40);
          emit_op(s,'\x0f');
          emit_op(s,'\x0f');
          emit_op(s,'\x0f');
          return 0;
        }
        fmt = "yield in default expression";
      }
      js_parse_error(s,fmt);
      return -1;
    }
  }
  iVar3 = js_parse_logical_and_or(s,-0x5e,parse_flags | 4);
  if (iVar3 == 0) {
    iVar3 = (s->token).val;
    if (iVar3 == -0x5a) {
      local_48 = JVar5;
      iVar3 = new_label(s);
      local_3c = parse_flags;
      do {
        iVar4 = next_token(s);
        if (iVar4 != 0) {
          return -1;
        }
        emit_op(s,'\x11');
        emit_op(s,0xb0);
        emit_goto(s,0x69,iVar3);
        emit_op(s,'\x0e');
        iVar4 = js_parse_expr_binary(s,8,parse_flags & 0xfffffffb);
        if (iVar4 != 0) {
          return -1;
        }
      } while ((s->token).val == -0x5a);
      emit_label(s,iVar3);
      iVar3 = (s->token).val;
      parse_flags = local_3c;
      JVar5 = local_48;
    }
    if (iVar3 == 0x3f) {
      iVar3 = next_token(s);
      if (iVar3 != 0) {
        return -1;
      }
      local_48 = JVar5;
      iVar3 = emit_goto(s,0x69,-1);
      iVar4 = js_parse_assign_expr(s);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = js_parse_expect(s,0x3a);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = emit_goto(s,0x6b,-1);
      emit_label(s,iVar3);
      iVar3 = js_parse_assign_expr2(s,parse_flags & 1);
      if (iVar3 != 0) {
        return -1;
      }
      emit_label(s,iVar4);
      iVar3 = (s->token).val;
      JVar5 = local_48;
    }
    if (iVar3 == 0x3d || iVar3 + 0x7bU < 0xc) {
      iVar4 = next_token(s);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = get_lvalue(s,&opcode,&scope,&name,&label,(int *)0x0,(uint)(iVar3 != 0x3d),iVar3);
      if (iVar4 < 0) {
        return -1;
      }
      iVar4 = js_parse_assign_expr2(s,parse_flags);
      if (iVar4 == 0) {
        if (iVar3 == 0x3d) {
          if ((opcode == 0x3c) && (opcode = 0x3c, name == JVar5)) {
            set_object_name(s,JVar5);
            name = JVar5;
          }
        }
        else {
          emit_op(s,js_parse_assign_expr2::assign_opcodes[iVar3 + 0x7bU]);
        }
        put_lvalue(s,opcode,scope,name,label,PUT_LVALUE_KEEP_TOP,0);
        return 0;
      }
    }
    else {
      if (2 < iVar3 + 0x6fU) {
        return 0;
      }
      iVar4 = next_token(s);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = get_lvalue(s,&opcode,&scope,&name,&label,&depth_lvalue,1,iVar3);
      if (iVar4 < 0) {
        return -1;
      }
      emit_op(s,'\x11');
      if (iVar3 == -0x6d) {
        emit_op(s,0xb0);
      }
      iVar3 = emit_goto(s,(iVar3 == -0x6e) + 0x69,-1);
      emit_op(s,'\x0e');
      iVar4 = js_parse_assign_expr2(s,parse_flags);
      if (iVar4 == 0) {
        if ((opcode == 0x3c) && (name == JVar5)) {
          set_object_name(s,JVar5);
        }
        if (depth_lvalue - 1U < 3) {
          emit_op(s,(char)(depth_lvalue - 1U) + '\x15');
          put_lvalue(s,opcode,scope,name,label,PUT_LVALUE_NOKEEP_DEPTH,0);
          iVar4 = emit_goto(s,0x6b,-1);
          emit_label(s,iVar3);
          for (; depth_lvalue != 0; depth_lvalue = depth_lvalue + -1) {
            emit_op(s,'\x0f');
          }
          emit_label(s,iVar4);
          return 0;
        }
        abort();
      }
    }
    JS_FreeAtom(s->ctx,name);
  }
  return -1;
}

Assistant:

static __exception int js_parse_assign_expr2(JSParseState *s, int parse_flags)
{
    int opcode, op, scope;
    JSAtom name0 = JS_ATOM_NULL;
    JSAtom name;

    if (s->token.val == TOK_YIELD) {
        BOOL is_star = FALSE, is_async;
        
        if (!(s->cur_func->func_kind & JS_FUNC_GENERATOR))
            return js_parse_error(s, "unexpected 'yield' keyword");
        if (!s->cur_func->in_function_body)
            return js_parse_error(s, "yield in default expression");
        if (next_token(s))
            return -1;
        /* XXX: is there a better method to detect 'yield' without
           parameters ? */
        if (s->token.val != ';' && s->token.val != ')' &&
            s->token.val != ']' && s->token.val != '}' &&
            s->token.val != ',' && s->token.val != ':' && !s->got_lf) {
            if (s->token.val == '*') {
                is_star = TRUE;
                if (next_token(s))
                    return -1;
            }
            if (js_parse_assign_expr2(s, parse_flags))
                return -1;
        } else {
            emit_op(s, OP_undefined);
        }
        is_async = (s->cur_func->func_kind == JS_FUNC_ASYNC_GENERATOR);

        if (is_star) {
            int label_loop, label_return, label_next;
            int label_return1, label_yield, label_throw, label_throw1;
            int label_throw2;

            label_loop = new_label(s);
            label_yield = new_label(s);

            emit_op(s, is_async ? OP_for_await_of_start : OP_for_of_start);

            /* remove the catch offset (XXX: could avoid pushing back
               undefined) */
            emit_op(s, OP_drop);
            emit_op(s, OP_undefined);
            
            emit_op(s, OP_undefined); /* initial value */
            
            emit_label(s, label_loop);
            emit_op(s, OP_iterator_next);
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_iterator_check_object);
            emit_op(s, OP_get_field2);
            emit_atom(s, JS_ATOM_done);
            label_next = emit_goto(s, OP_if_true, -1); /* end of loop */
            emit_label(s, label_yield);
            if (is_async) {
                /* OP_async_yield_star takes the value as parameter */
                emit_op(s, OP_get_field);
                emit_atom(s, JS_ATOM_value);
                emit_op(s, OP_await);
                emit_op(s, OP_async_yield_star);
            } else {
                /* OP_yield_star takes (value, done) as parameter */
                emit_op(s, OP_yield_star);
            }
            emit_op(s, OP_dup);
            label_return = emit_goto(s, OP_if_true, -1);
            emit_op(s, OP_drop);
            emit_goto(s, OP_goto, label_loop);
            
            emit_label(s, label_return);
            emit_op(s, OP_push_i32);
            emit_u32(s, 2);
            emit_op(s, OP_strict_eq);
            label_throw = emit_goto(s, OP_if_true, -1);
            
            /* return handling */
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_iterator_call);
            emit_u8(s, 0);
            label_return1 = emit_goto(s, OP_if_true, -1);
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_iterator_check_object);
            emit_op(s, OP_get_field2);
            emit_atom(s, JS_ATOM_done);
            emit_goto(s, OP_if_false, label_yield);

            emit_op(s, OP_get_field);
            emit_atom(s, JS_ATOM_value);
            
            emit_label(s, label_return1);
            emit_op(s, OP_nip);
            emit_op(s, OP_nip);
            emit_op(s, OP_nip);
            emit_return(s, TRUE);
            
            /* throw handling */
            emit_label(s, label_throw);
            emit_op(s, OP_iterator_call);
            emit_u8(s, 1);
            label_throw1 = emit_goto(s, OP_if_true, -1);
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_iterator_check_object);
            emit_op(s, OP_get_field2);
            emit_atom(s, JS_ATOM_done);
            emit_goto(s, OP_if_false, label_yield);
            emit_goto(s, OP_goto, label_next);
            /* close the iterator and throw a type error exception */
            emit_label(s, label_throw1);
            emit_op(s, OP_iterator_call);
            emit_u8(s, 2);
            label_throw2 = emit_goto(s, OP_if_true, -1);
            if (is_async)
                emit_op(s, OP_await);
            emit_label(s, label_throw2);

            emit_op(s, OP_throw_error);
            emit_atom(s, JS_ATOM_NULL);
            emit_u8(s, JS_THROW_ERROR_ITERATOR_THROW);
            
            emit_label(s, label_next);
            emit_op(s, OP_get_field);
            emit_atom(s, JS_ATOM_value);
            emit_op(s, OP_nip); /* keep the value associated with
                                   done = true */
            emit_op(s, OP_nip);
            emit_op(s, OP_nip);
        } else {
            int label_next;
            
            if (is_async)
                emit_op(s, OP_await);
            emit_op(s, OP_yield);
            label_next = emit_goto(s, OP_if_false, -1);
            emit_return(s, TRUE);
            emit_label(s, label_next);
        }
        return 0;
    }
    if (s->token.val == TOK_IDENT) {
        /* name0 is used to check for OP_set_name pattern, not duplicated */
        name0 = s->token.u.ident.atom;
    }
    if (js_parse_cond_expr(s, parse_flags | PF_ARROW_FUNC))
        return -1;

    op = s->token.val;
    if (op == '=' || (op >= TOK_MUL_ASSIGN && op <= TOK_POW_ASSIGN)) {
        int label;
        if (next_token(s))
            return -1;
        if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, (op != '='), op) < 0)
            return -1;

        if (js_parse_assign_expr2(s, parse_flags)) {
            JS_FreeAtom(s->ctx, name);
            return -1;
        }

        if (op == '=') {
            if (opcode == OP_get_ref_value && name == name0) {
                set_object_name(s, name);
            }
        } else {
            static const uint8_t assign_opcodes[] = {
                OP_mul, OP_div, OP_mod, OP_add, OP_sub,
                OP_shl, OP_sar, OP_shr, OP_and, OP_xor, OP_or,
#ifdef CONFIG_BIGNUM
                OP_pow,
#endif
                OP_pow,
            };
            op = assign_opcodes[op - TOK_MUL_ASSIGN];
#ifdef CONFIG_BIGNUM
            if (s->cur_func->js_mode & JS_MODE_MATH) {
                if (op == OP_mod)
                    op = OP_math_mod;
            }
#endif
            emit_op(s, op);
        }
        put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_TOP, FALSE);
    } else if (op >= TOK_LAND_ASSIGN && op <= TOK_DOUBLE_QUESTION_MARK_ASSIGN) {
        int label, label1, depth_lvalue, label2;
        
        if (next_token(s))
            return -1;
        if (get_lvalue(s, &opcode, &scope, &name, &label,
                       &depth_lvalue, TRUE, op) < 0)
            return -1;

        emit_op(s, OP_dup);
        if (op == TOK_DOUBLE_QUESTION_MARK_ASSIGN)
            emit_op(s, OP_is_undefined_or_null);
        label1 = emit_goto(s, op == TOK_LOR_ASSIGN ? OP_if_true : OP_if_false,
                           -1);
        emit_op(s, OP_drop);
        
        if (js_parse_assign_expr2(s, parse_flags)) {
            JS_FreeAtom(s->ctx, name);
            return -1;
        }

        if (opcode == OP_get_ref_value && name == name0) {
            set_object_name(s, name);
        }
        
        switch(depth_lvalue) {
        case 1:
            emit_op(s, OP_insert2);
            break;
        case 2:
            emit_op(s, OP_insert3);
            break;
        case 3:
            emit_op(s, OP_insert4);
            break;
        default:
            abort();
        }

        /* XXX: we disable the OP_put_ref_value optimization by not
           using put_lvalue() otherwise depth_lvalue is not correct */
        put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_NOKEEP_DEPTH,
                   FALSE);
        label2 = emit_goto(s, OP_goto, -1);
        
        emit_label(s, label1);

        /* remove the lvalue stack entries */
        while (depth_lvalue != 0) {
            emit_op(s, OP_nip);
            depth_lvalue--;
        }

        emit_label(s, label2);
    }
    return 0;
}